

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int vdbeSorterFlushPMA(VdbeSorter *pSorter)

{
  int *piVar1;
  SorterFile *ppFd;
  sqlite3 *db;
  SorterRecord *pSVar2;
  int iVar3;
  SorterRecord *p;
  sqlite3_file *pFd;
  PmaWriter writer;
  PmaWriter local_68;
  
  pSorter->bUsePMA = '\x01';
  db = (pSorter->aTask[0].pSorter)->db;
  local_68.iWriteOff = 0;
  local_68.pFd = (sqlite3_file *)0x0;
  local_68.nBuffer = 0;
  local_68.iBufStart = 0;
  local_68.iBufEnd = 0;
  local_68._28_4_ = 0;
  local_68.eFWErr = 0;
  local_68._4_4_ = 0;
  local_68.aBuffer = (u8 *)0x0;
  pFd = pSorter->aTask[0].file.pFd;
  if (pFd == (sqlite3_file *)0x0) {
    ppFd = &pSorter->aTask[0].file;
    iVar3 = vdbeSorterOpenTempFile(db,0,&ppFd->pFd);
    if (iVar3 != 0) {
      return iVar3;
    }
    pFd = ppFd->pFd;
  }
  vdbeSorterExtendFile(db,pFd,pSorter->aTask[0].file.iEof + (long)(pSorter->list).szPMA + 9);
  iVar3 = vdbeSorterSort(pSorter->aTask,&pSorter->list);
  if (iVar3 == 0) {
    vdbePmaWriterInit(pSorter->aTask[0].file.pFd,&local_68,(pSorter->aTask[0].pSorter)->pgsz,
                      pSorter->aTask[0].file.iEof);
    piVar1 = &pSorter->aTask[0].nPMA;
    *piVar1 = *piVar1 + 1;
    vdbePmaWriteVarint(&local_68,(long)(pSorter->list).szPMA);
    pSVar2 = (pSorter->list).pList;
    while (p = pSVar2, p != (SorterRecord *)0x0) {
      pSVar2 = (p->u).pNext;
      vdbePmaWriteVarint(&local_68,(long)p->nVal);
      vdbePmaWriteBlob(&local_68,(u8 *)(p + 1),p->nVal);
      if ((pSorter->list).aMemory == (u8 *)0x0) {
        sqlite3_free(p);
      }
    }
    (pSorter->list).pList = (SorterRecord *)0x0;
    iVar3 = vdbePmaWriterFinish(&local_68,&pSorter->aTask[0].file.iEof);
  }
  return iVar3;
}

Assistant:

static int vdbeSorterFlushPMA(VdbeSorter *pSorter){
#if SQLITE_MAX_WORKER_THREADS==0
  pSorter->bUsePMA = 1;
  return vdbeSorterListToPMA(&pSorter->aTask[0], &pSorter->list);
#else
  int rc = SQLITE_OK;
  int i;
  SortSubtask *pTask = 0;    /* Thread context used to create new PMA */
  int nWorker = (pSorter->nTask-1);

  /* Set the flag to indicate that at least one PMA has been written. 
  ** Or will be, anyhow.  */
  pSorter->bUsePMA = 1;

  /* Select a sub-task to sort and flush the current list of in-memory
  ** records to disk. If the sorter is running in multi-threaded mode,
  ** round-robin between the first (pSorter->nTask-1) tasks. Except, if
  ** the background thread from a sub-tasks previous turn is still running,
  ** skip it. If the first (pSorter->nTask-1) sub-tasks are all still busy,
  ** fall back to using the final sub-task. The first (pSorter->nTask-1)
  ** sub-tasks are prefered as they use background threads - the final 
  ** sub-task uses the main thread. */
  for(i=0; i<nWorker; i++){
    int iTest = (pSorter->iPrev + i + 1) % nWorker;
    pTask = &pSorter->aTask[iTest];
    if( pTask->bDone ){
      rc = vdbeSorterJoinThread(pTask);
    }
    if( rc!=SQLITE_OK || pTask->pThread==0 ) break;
  }

  if( rc==SQLITE_OK ){
    if( i==nWorker ){
      /* Use the foreground thread for this operation */
      rc = vdbeSorterListToPMA(&pSorter->aTask[nWorker], &pSorter->list);
    }else{
      /* Launch a background thread for this operation */
      u8 *aMem = pTask->list.aMemory;
      void *pCtx = (void*)pTask;

      assert( pTask->pThread==0 && pTask->bDone==0 );
      assert( pTask->list.pList==0 );
      assert( pTask->list.aMemory==0 || pSorter->list.aMemory!=0 );

      pSorter->iPrev = (u8)(pTask - pSorter->aTask);
      pTask->list = pSorter->list;
      pSorter->list.pList = 0;
      pSorter->list.szPMA = 0;
      if( aMem ){
        pSorter->list.aMemory = aMem;
        pSorter->nMemory = sqlite3MallocSize(aMem);
      }else if( pSorter->list.aMemory ){
        pSorter->list.aMemory = sqlite3Malloc(pSorter->nMemory);
        if( !pSorter->list.aMemory ) return SQLITE_NOMEM_BKPT;
      }

      rc = vdbeSorterCreateThread(pTask, vdbeSorterFlushThread, pCtx);
    }
  }

  return rc;
#endif /* SQLITE_MAX_WORKER_THREADS!=0 */
}